

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ring_buffer.cpp
# Opt level: O0

void basic_api_test<ring_buffer_base<short>>(ring_buffer_base<short> *ring)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_;
  int rv;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int in_stack_fffffffffffffddc;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  Message *in_stack_fffffffffffffdf0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdf8;
  AssertHelper in_stack_fffffffffffffe00;
  Message local_1f8;
  undefined4 local_1f0;
  int local_1ec;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  int in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe3c;
  ring_buffer_base<short> *in_stack_fffffffffffffe40;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined4 local_1a0;
  int local_19c;
  AssertionResult local_198;
  AssertHelper local_188;
  Message local_180;
  undefined4 local_178;
  int local_174;
  AssertionResult local_170;
  AssertHelper local_160;
  Message local_158;
  undefined4 local_150;
  int local_14c;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  undefined4 local_124;
  AssertionResult local_120;
  AssertHelper local_110;
  Message local_108;
  undefined4 local_100;
  int local_fc;
  AssertionResult local_f8;
  AssertHelper local_e8;
  Message local_e0;
  undefined4 local_d8;
  int local_d4;
  AssertionResult local_d0;
  String local_c0;
  AssertHelper local_b0;
  Message local_a8;
  AssertionResult local_a0;
  int local_8c;
  AssertHelper local_88;
  Message local_80;
  undefined4 local_78;
  int local_74;
  AssertionResult local_70;
  AssertHelper local_60;
  Message local_58;
  undefined4 local_50;
  int local_4c;
  AssertionResult local_48;
  uint local_34;
  AssertHelper local_30;
  Message local_28;
  undefined4 local_20;
  int local_1c;
  AssertionResult local_18;
  
  local_1c = ring_buffer_base<short>::capacity((ring_buffer_base<short> *)0x133b3c);
  local_20 = 0x80;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffffdf8.ptr_,(char *)in_stack_fffffffffffffdf0,
             (int *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             (int *)in_stack_fffffffffffffde0.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(in_stack_fffffffffffffdf0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x133ba8);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=(&local_30,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::Message::~Message((Message *)0x133bf8);
  }
  local_34 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x133c1d);
  if (local_34 == 0) {
    local_4c = ring_buffer_base<short>::available_read
                         ((ring_buffer_base<short> *)in_stack_fffffffffffffe00.data_);
    local_50 = 0;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((char *)in_stack_fffffffffffffdf8.ptr_,(char *)in_stack_fffffffffffffdf0,
               (int *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               (int *)in_stack_fffffffffffffde0.ptr_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_48);
    if (!bVar1) {
      testing::Message::Message(in_stack_fffffffffffffdf0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x133ca8);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                 ,0x84,pcVar3);
      testing::internal::AssertHelper::operator=(&local_60,&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::Message::~Message((Message *)0x133cf8);
    }
    local_34 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x133d1d);
    if (local_34 == 0) {
      local_74 = ring_buffer_base<short>::available_write
                           ((ring_buffer_base<short> *)in_stack_fffffffffffffe00.data_);
      local_78 = 0x80;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)in_stack_fffffffffffffdf8.ptr_,(char *)in_stack_fffffffffffffdf0,
                 (int *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                 (int *)in_stack_fffffffffffffde0.ptr_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
      if (!bVar1) {
        testing::Message::Message(in_stack_fffffffffffffdf0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x133da8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                   ,0x85,pcVar3);
        testing::internal::AssertHelper::operator=(&local_88,&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        testing::Message::~Message((Message *)0x133df8);
      }
      local_34 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x133e1d);
      if (local_34 == 0) {
        local_8c = ring_buffer_base<short>::enqueue_default
                             ((ring_buffer_base<short> *)in_stack_fffffffffffffde0.ptr_,
                              in_stack_fffffffffffffddc);
        testing::AssertionResult::AssertionResult
                  ((AssertionResult *)in_stack_fffffffffffffde0.ptr_,
                   SUB41((uint)in_stack_fffffffffffffddc >> 0x18,0));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
        if (!bVar1) {
          testing::Message::Message(in_stack_fffffffffffffdf0);
          testing::internal::GetBoolAssertionFailureMessage
                    ((internal *)&local_c0,&local_a0,"rv == 63","false","true");
          pcVar3 = testing::internal::String::c_str(&local_c0);
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                     ,0x89,pcVar3);
          testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          testing::internal::String::~String((String *)in_stack_fffffffffffffde0.ptr_);
          testing::Message::~Message((Message *)0x133f1f);
        }
        local_34 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x133f44);
        if (local_34 == 0) {
          local_d4 = ring_buffer_base<short>::available_read
                               ((ring_buffer_base<short> *)in_stack_fffffffffffffe00.data_);
          local_d8 = 0x3f;
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((char *)in_stack_fffffffffffffdf8.ptr_,(char *)in_stack_fffffffffffffdf0,
                     (int *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                     (int *)in_stack_fffffffffffffde0.ptr_);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
          if (!bVar1) {
            testing::Message::Message(in_stack_fffffffffffffdf0);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x133fcf);
            testing::internal::AssertHelper::AssertHelper
                      (&local_e8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                       ,0x8a,pcVar3);
            testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
            testing::internal::AssertHelper::~AssertHelper(&local_e8);
            testing::Message::~Message((Message *)0x13401f);
          }
          local_34 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x134044);
          if (local_34 == 0) {
            local_fc = ring_buffer_base<short>::available_write
                                 ((ring_buffer_base<short> *)in_stack_fffffffffffffe00.data_);
            local_100 = 0x41;
            testing::internal::EqHelper<false>::Compare<int,int>
                      ((char *)in_stack_fffffffffffffdf8.ptr_,(char *)in_stack_fffffffffffffdf0,
                       (int *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                       (int *)in_stack_fffffffffffffde0.ptr_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
            if (!bVar1) {
              testing::Message::Message(in_stack_fffffffffffffdf0);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1340cf);
              testing::internal::AssertHelper::AssertHelper
                        (&local_110,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                         ,0x8b,pcVar3);
              testing::internal::AssertHelper::operator=(&local_110,&local_108);
              testing::internal::AssertHelper::~AssertHelper(&local_110);
              testing::Message::~Message((Message *)0x13411f);
            }
            local_34 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x134144);
            if (local_34 == 0) {
              local_8c = ring_buffer_base<short>::enqueue_default
                                   ((ring_buffer_base<short> *)in_stack_fffffffffffffde0.ptr_,
                                    in_stack_fffffffffffffddc);
              local_124 = 0x41;
              testing::internal::EqHelper<false>::Compare<int,int>
                        ((char *)in_stack_fffffffffffffdf8.ptr_,(char *)in_stack_fffffffffffffdf0,
                         (int *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                         (int *)in_stack_fffffffffffffde0.ptr_);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
              if (!bVar1) {
                testing::Message::Message(in_stack_fffffffffffffdf0);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1341d4);
                testing::internal::AssertHelper::AssertHelper
                          (&local_138,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                           ,0x8f,pcVar3);
                testing::internal::AssertHelper::operator=(&local_138,&local_130);
                testing::internal::AssertHelper::~AssertHelper(&local_138);
                testing::Message::~Message((Message *)0x134224);
              }
              local_34 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x134249);
              if (local_34 == 0) {
                local_14c = ring_buffer_base<short>::available_read
                                      ((ring_buffer_base<short> *)in_stack_fffffffffffffe00.data_);
                local_150 = 0x80;
                testing::internal::EqHelper<false>::Compare<int,int>
                          ((char *)in_stack_fffffffffffffdf8.ptr_,(char *)in_stack_fffffffffffffdf0,
                           (int *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                           (int *)in_stack_fffffffffffffde0.ptr_);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
                if (!bVar1) {
                  testing::Message::Message(in_stack_fffffffffffffdf0);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1342d4);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_160,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                             ,0x90,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_160,&local_158);
                  testing::internal::AssertHelper::~AssertHelper(&local_160);
                  testing::Message::~Message((Message *)0x134324);
                }
                local_34 = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x134349);
                if (local_34 == 0) {
                  local_174 = ring_buffer_base<short>::available_write
                                        ((ring_buffer_base<short> *)in_stack_fffffffffffffe00.data_)
                  ;
                  local_178 = 0;
                  testing::internal::EqHelper<false>::Compare<int,int>
                            ((char *)in_stack_fffffffffffffdf8.ptr_,
                             (char *)in_stack_fffffffffffffdf0,
                             (int *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                             (int *)in_stack_fffffffffffffde0.ptr_);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_170);
                  if (!bVar1) {
                    testing::Message::Message(in_stack_fffffffffffffdf0);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1343d4);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_188,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                               ,0x91,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_188,&local_180);
                    testing::internal::AssertHelper::~AssertHelper(&local_188);
                    testing::Message::~Message((Message *)0x134424);
                  }
                  local_34 = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x134449);
                  if (local_34 == 0) {
                    local_8c = ring_buffer_base<short>::dequeue
                                         (in_stack_fffffffffffffe40,
                                          (short *)CONCAT44(in_stack_fffffffffffffe3c,
                                                            in_stack_fffffffffffffe38),
                                          in_stack_fffffffffffffe34);
                    local_19c = ring_buffer_base<short>::available_read
                                          ((ring_buffer_base<short> *)
                                           in_stack_fffffffffffffe00.data_);
                    local_1a0 = 0x41;
                    testing::internal::EqHelper<false>::Compare<int,int>
                              ((char *)in_stack_fffffffffffffdf8.ptr_,
                               (char *)in_stack_fffffffffffffdf0,
                               (int *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                               (int *)in_stack_fffffffffffffde0.ptr_);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_198);
                    if (!bVar1) {
                      testing::Message::Message(in_stack_fffffffffffffdf0);
                      pcVar3 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)0x1344f1);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_1b0,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                                 ,0x95,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
                      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
                      testing::Message::~Message((Message *)0x134538);
                    }
                    local_34 = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13455d);
                    if (local_34 == 0) {
                      iVar2 = ring_buffer_base<short>::available_write
                                        ((ring_buffer_base<short> *)in_stack_fffffffffffffe00.data_)
                      ;
                      uVar4 = 0x3f;
                      testing::internal::EqHelper<false>::Compare<int,int>
                                ((char *)in_stack_fffffffffffffdf8.ptr_,
                                 (char *)in_stack_fffffffffffffdf0,
                                 (int *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8
                                                ),(int *)in_stack_fffffffffffffde0.ptr_);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)&stack0xfffffffffffffe40);
                      if (!bVar1) {
                        testing::Message::Message(in_stack_fffffffffffffdf0);
                        pcVar3 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)0x1345d0);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_1d8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                                   ,0x96,pcVar3);
                        testing::internal::AssertHelper::operator=
                                  (&local_1d8,(Message *)&stack0xfffffffffffffe30);
                        testing::internal::AssertHelper::~AssertHelper(&local_1d8);
                        testing::Message::~Message((Message *)0x134611);
                      }
                      local_34 = (uint)!bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)0x134633);
                      if (local_34 == 0) {
                        local_8c = ring_buffer_base<short>::dequeue
                                             (in_stack_fffffffffffffe40,
                                              (short *)CONCAT44(iVar2,uVar4),
                                              in_stack_fffffffffffffe34);
                        local_1ec = ring_buffer_base<short>::available_read
                                              ((ring_buffer_base<short> *)
                                               in_stack_fffffffffffffe00.data_);
                        local_1f0 = 0;
                        testing::internal::EqHelper<false>::Compare<int,int>
                                  ((char *)in_stack_fffffffffffffdf8.ptr_,
                                   (char *)in_stack_fffffffffffffdf0,
                                   (int *)CONCAT44(in_stack_fffffffffffffdec,
                                                   in_stack_fffffffffffffde8),
                                   (int *)in_stack_fffffffffffffde0.ptr_);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
                        if (!bVar1) {
                          testing::Message::Message(in_stack_fffffffffffffdf0);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)0x1346c3);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&stack0xfffffffffffffe00,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                                     ,0x9a,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&stack0xfffffffffffffe00,&local_1f8);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&stack0xfffffffffffffe00);
                          testing::Message::~Message((Message *)0x134704);
                        }
                        local_34 = (uint)!bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)0x134726);
                        if (local_34 == 0) {
                          iVar2 = ring_buffer_base<short>::available_write
                                            ((ring_buffer_base<short> *)
                                             in_stack_fffffffffffffe00.data_);
                          testing::internal::EqHelper<false>::Compare<int,int>
                                    ((char *)in_stack_fffffffffffffdf8.ptr_,
                                     (char *)in_stack_fffffffffffffdf0,(int *)CONCAT44(iVar2,0x80),
                                     (int *)in_stack_fffffffffffffde0.ptr_);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)&stack0xfffffffffffffdf0);
                          if (!bVar1) {
                            testing::Message::Message(in_stack_fffffffffffffdf0);
                            pcVar3 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)0x134799);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&stack0xfffffffffffffdd8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                                       ,0x9b,pcVar3);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&stack0xfffffffffffffdd8,
                                       (Message *)&stack0xfffffffffffffde0);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&stack0xfffffffffffffdd8);
                            testing::Message::~Message((Message *)0x1347d4);
                          }
                          local_34 = (uint)!bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1347f6);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void basic_api_test(T& ring)
{
  ASSERT_EQ(ring.capacity(), 128);

  ASSERT_EQ(ring.available_read(), 0);
  ASSERT_EQ(ring.available_write(), 128);

  int rv = ring.enqueue_default(63);

  ASSERT_TRUE(rv == 63);
  ASSERT_EQ(ring.available_read(), 63);
  ASSERT_EQ(ring.available_write(), 65);

  rv = ring.enqueue_default(65);

  ASSERT_EQ(rv, 65);
  ASSERT_EQ(ring.available_read(), 128);
  ASSERT_EQ(ring.available_write(), 0);

  rv = ring.dequeue(nullptr, 63);

  ASSERT_EQ(ring.available_read(), 65);
  ASSERT_EQ(ring.available_write(), 63);

  rv = ring.dequeue(nullptr, 65);

  ASSERT_EQ(ring.available_read(), 0);
  ASSERT_EQ(ring.available_write(), 128);
}